

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcurrentQueue.h
# Opt level: O0

ImplicitProducer * __thiscall
moodycamel::ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits>::
get_or_add_implicit_producer
          (ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits> *this)

{
  char cVar1;
  ulong uVar2;
  undefined1 *puVar3;
  ImplicitProducerKVP *pIVar4;
  long in_RDI;
  thread_id_t empty_1;
  __int_type probedKey_1;
  size_t index_1;
  ImplicitProducer *producer;
  bool recycled;
  size_t i;
  ImplicitProducerHash *newHash;
  char *raw;
  size_t newCapacity;
  __int_type newCount;
  thread_id_t empty;
  ImplicitProducer *value;
  __int_type probedKey;
  size_t index;
  __pointer_type hash;
  __pointer_type mainHash;
  size_t hashedId;
  thread_id_t id;
  memory_order __b_5;
  memory_order __b_4;
  memory_order __b_2;
  memory_order __b_3;
  memory_order __b_6;
  memory_order __b_1;
  memory_order __b;
  memory_order in_stack_fffffffffffffac4;
  __pointer_type in_stack_fffffffffffffac8;
  atomic<moodycamel::ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits>::ImplicitProducerHash_*>
  *in_stack_fffffffffffffad0;
  bool *in_stack_fffffffffffffae8;
  undefined1 in_stack_fffffffffffffaf7;
  ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits> *in_stack_fffffffffffffaf8;
  thread_id_t local_248;
  __int_type local_240;
  size_t local_238;
  ImplicitProducer *local_230;
  byte local_221;
  ulong local_220;
  __pointer_type local_218;
  __pointer_type local_210;
  ulong local_208;
  ulong local_200;
  thread_id_t local_1f8;
  ImplicitProducer *local_1f0;
  thread_id_t local_1e8;
  size_t local_1e0;
  __pointer_type local_1d8;
  __pointer_type local_1d0;
  size_t local_1c8;
  thread_id_t local_1c0;
  memory_order local_1a8;
  int local_1a4;
  undefined1 *local_1a0;
  memory_order local_198;
  int local_194;
  undefined1 *local_190;
  int local_184;
  undefined1 *local_180;
  __int_type local_178;
  memory_order local_170;
  int local_16c;
  __int_type local_168;
  ImplicitProducerKVP *local_160;
  __int_type local_158;
  memory_order local_150;
  int local_14c;
  ImplicitProducerKVP *local_148;
  thread_id_t local_140;
  memory_order local_138;
  int local_134;
  ImplicitProducerKVP *local_130;
  thread_id_t local_128;
  memory_order local_120;
  int local_11c;
  ImplicitProducerKVP *local_118;
  undefined1 local_109;
  thread_id_t local_108;
  undefined4 local_100;
  undefined4 local_fc;
  thread_id_t local_f8;
  thread_id_t *local_f0;
  ImplicitProducerKVP *local_e8;
  undefined1 local_d9;
  thread_id_t local_d8;
  undefined4 local_d0;
  undefined4 local_cc;
  thread_id_t local_c8;
  thread_id_t *local_c0;
  ImplicitProducerKVP *local_b8;
  long local_b0;
  undefined8 local_a8;
  undefined4 local_9c;
  undefined8 local_98;
  long *local_90;
  undefined4 local_84;
  char *local_80;
  long local_78;
  undefined8 local_70;
  undefined4 local_64;
  undefined8 local_60;
  long *local_58;
  long local_28;
  undefined8 local_20;
  undefined4 local_14;
  undefined8 local_10;
  long *local_8;
  
  local_1c0 = details::thread_id();
  local_1c8 = details::hash_thread_id(0x120da9);
  local_1d8 = std::
              atomic<moodycamel::ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits>::ImplicitProducerHash_*>
              ::load((atomic<moodycamel::ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits>::ImplicitProducerHash_*>
                      *)in_stack_fffffffffffffac8,in_stack_fffffffffffffac4);
  local_1d0 = local_1d8;
  do {
    if (local_1d8 == (__pointer_type)0x0) {
      local_90 = (long *)(in_RDI + 0x38);
      local_98 = 1;
      local_9c = 0;
      local_a8 = 1;
      LOCK();
      local_b0 = *local_90;
      *local_90 = *local_90 + 1;
      UNLOCK();
      local_200 = local_b0 + 1;
      do {
        if (local_1d0->capacity >> 1 <= local_200) {
          local_80 = (char *)(in_RDI + 600);
          local_84 = 2;
          LOCK();
          cVar1 = *local_80;
          *local_80 = '\x01';
          UNLOCK();
          if (cVar1 == '\0') {
            local_1d0 = std::
                        atomic<moodycamel::ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits>::ImplicitProducerHash_*>
                        ::load((atomic<moodycamel::ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits>::ImplicitProducerHash_*>
                                *)in_stack_fffffffffffffac8,in_stack_fffffffffffffac4);
            if (local_200 < local_1d0->capacity >> 1) {
              puVar3 = (undefined1 *)(in_RDI + 600);
              local_1a4 = 3;
              local_1a0 = puVar3;
              local_1a8 = std::operator&(memory_order_release,__memory_order_mask);
              if (local_1a4 == 3) {
                *puVar3 = 0;
              }
              else if (local_1a4 == 5) {
                LOCK();
                *puVar3 = 0;
                UNLOCK();
              }
              else {
                *puVar3 = 0;
              }
            }
            else {
              local_208 = local_1d0->capacity;
              do {
                uVar2 = local_208;
                local_208 = uVar2 << 1;
              } while ((uVar2 & 0x7fffffffffffffff) <= local_200);
              local_210 = (__pointer_type)ConcurrentQueueDefaultTraits::malloc(uVar2 * 0x20 + 0x1f);
              if (local_210 == (__pointer_type)0x0) {
                local_8 = (long *)(in_RDI + 0x38);
                local_10 = 1;
                local_14 = 0;
                local_20 = 1;
                LOCK();
                local_28 = *local_8;
                *local_8 = *local_8 + -1;
                UNLOCK();
                puVar3 = (undefined1 *)(in_RDI + 600);
                local_184 = 0;
                local_180 = puVar3;
                std::operator&(memory_order_relaxed,__memory_order_mask);
                if (local_184 == 3) {
                  *puVar3 = 0;
                }
                else if (local_184 == 5) {
                  LOCK();
                  *puVar3 = 0;
                  UNLOCK();
                }
                else {
                  *puVar3 = 0;
                }
                return (ImplicitProducer *)0x0;
              }
              local_210->capacity = local_208;
              local_218 = local_210;
              pIVar4 = (ImplicitProducerKVP *)
                       details::
                       align_for<moodycamel::ConcurrentQueue<CSP_Event,moodycamel::ConcurrentQueueDefaultTraits>::ImplicitProducerKVP>
                                 ((char *)(local_210 + 1));
              local_218->entries = pIVar4;
              for (local_220 = 0; local_220 != local_208; local_220 = local_220 + 1) {
                ImplicitProducerKVP::ImplicitProducerKVP(local_218->entries + local_220);
                pIVar4 = local_218->entries + local_220;
                local_168 = 0;
                local_16c = 0;
                local_160 = pIVar4;
                local_170 = std::operator&(memory_order_relaxed,__memory_order_mask);
                local_178 = local_168;
                if (local_16c == 3) {
                  (pIVar4->key).super___atomic_base<unsigned_long>._M_i = local_168;
                }
                else if (local_16c == 5) {
                  LOCK();
                  (pIVar4->key).super___atomic_base<unsigned_long>._M_i = local_168;
                  UNLOCK();
                }
                else {
                  (pIVar4->key).super___atomic_base<unsigned_long>._M_i = local_168;
                }
              }
              local_218->prev = local_1d0;
              std::
              atomic<moodycamel::ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits>::ImplicitProducerHash_*>
              ::store(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,in_stack_fffffffffffffac4)
              ;
              puVar3 = (undefined1 *)(in_RDI + 600);
              local_194 = 3;
              local_190 = puVar3;
              local_198 = std::operator&(memory_order_release,__memory_order_mask);
              if (local_194 == 3) {
                *puVar3 = 0;
              }
              else if (local_194 == 5) {
                LOCK();
                *puVar3 = 0;
                UNLOCK();
              }
              else {
                *puVar3 = 0;
              }
              local_1d0 = local_218;
            }
          }
        }
        if (local_200 < (local_1d0->capacity >> 1) + (local_1d0->capacity >> 2)) {
          local_230 = (ImplicitProducer *)
                      recycle_or_create_producer
                                (in_stack_fffffffffffffaf8,(bool)in_stack_fffffffffffffaf7,
                                 in_stack_fffffffffffffae8);
          if (local_230 == (ImplicitProducer *)0x0) {
            LOCK();
            *(long *)(in_RDI + 0x38) = *(long *)(in_RDI + 0x38) + -1;
            UNLOCK();
            return (ImplicitProducer *)0x0;
          }
          if ((local_221 & 1) != 0) {
            local_58 = (long *)(in_RDI + 0x38);
            local_60 = 1;
            local_64 = 0;
            local_70 = 1;
            LOCK();
            local_78 = *local_58;
            *local_58 = *local_58 + -1;
            UNLOCK();
          }
          local_238 = local_1c8;
          do {
            local_238 = local_238 & local_1d0->capacity - 1;
            pIVar4 = local_1d0->entries + local_238;
            local_14c = 0;
            local_148 = pIVar4;
            local_150 = std::operator&(memory_order_relaxed,__memory_order_mask);
            if (local_14c - 1U < 2) {
              local_158 = (pIVar4->key).super___atomic_base<unsigned_long>._M_i;
            }
            else if (local_14c == 5) {
              local_158 = (pIVar4->key).super___atomic_base<unsigned_long>._M_i;
            }
            else {
              local_158 = (pIVar4->key).super___atomic_base<unsigned_long>._M_i;
            }
            local_240 = local_158;
            local_248 = 0;
            if (local_158 == 0) {
              local_e8 = local_1d0->entries + local_238;
              local_f0 = &local_248;
              local_f8 = local_1c0;
              local_fc = 0;
              local_100 = 0;
              local_108 = local_1c0;
              LOCK();
              local_248 = (local_e8->key).super___atomic_base<unsigned_long>._M_i;
              local_109 = local_248 == 0;
              if ((bool)local_109) {
                (local_e8->key).super___atomic_base<unsigned_long>._M_i = local_1c0;
                local_248 = 0;
              }
              UNLOCK();
              if ((bool)local_109) {
                local_1d0->entries[local_238].value = local_230;
                return local_230;
              }
            }
            local_238 = local_238 + 1;
          } while( true );
        }
        local_1d0 = std::
                    atomic<moodycamel::ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits>::ImplicitProducerHash_*>
                    ::load((atomic<moodycamel::ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits>::ImplicitProducerHash_*>
                            *)in_stack_fffffffffffffac8,in_stack_fffffffffffffac4);
      } while( true );
    }
    local_1e0 = local_1c8;
    while( true ) {
      local_1e0 = local_1e0 & local_1d8->capacity - 1;
      pIVar4 = local_1d8->entries + local_1e0;
      local_11c = 0;
      local_118 = pIVar4;
      local_120 = std::operator&(memory_order_relaxed,__memory_order_mask);
      if (local_11c - 1U < 2) {
        local_128 = (pIVar4->key).super___atomic_base<unsigned_long>._M_i;
      }
      else if (local_11c == 5) {
        local_128 = (pIVar4->key).super___atomic_base<unsigned_long>._M_i;
      }
      else {
        local_128 = (pIVar4->key).super___atomic_base<unsigned_long>._M_i;
      }
      local_1e8 = local_128;
      if (local_128 == local_1c0) {
        local_1f0 = local_1d8->entries[local_1e0].value;
        if (local_1d8 == local_1d0) {
          return local_1f0;
        }
        local_1e0 = local_1c8;
        do {
          local_1e0 = local_1e0 & local_1d0->capacity - 1;
          pIVar4 = local_1d0->entries + local_1e0;
          local_134 = 0;
          local_130 = pIVar4;
          local_138 = std::operator&(memory_order_relaxed,__memory_order_mask);
          if (local_134 - 1U < 2) {
            local_140 = (pIVar4->key).super___atomic_base<unsigned_long>._M_i;
          }
          else if (local_134 == 5) {
            local_140 = (pIVar4->key).super___atomic_base<unsigned_long>._M_i;
          }
          else {
            local_140 = (pIVar4->key).super___atomic_base<unsigned_long>._M_i;
          }
          local_1e8 = local_140;
          local_1f8 = 0;
          if (local_140 == 0) {
            local_b8 = local_1d0->entries + local_1e0;
            local_c0 = &local_1f8;
            local_c8 = local_1c0;
            local_cc = 0;
            local_d0 = 0;
            local_d8 = local_1c0;
            LOCK();
            local_1f8 = (local_b8->key).super___atomic_base<unsigned_long>._M_i;
            local_d9 = local_1f8 == 0;
            if ((bool)local_d9) {
              (local_b8->key).super___atomic_base<unsigned_long>._M_i = local_1c0;
              local_1f8 = 0;
            }
            UNLOCK();
            if ((bool)local_d9) {
              local_1d0->entries[local_1e0].value = local_1f0;
              return local_1f0;
            }
          }
          local_1e0 = local_1e0 + 1;
        } while( true );
      }
      if (local_128 == 0) break;
      local_1e0 = local_1e0 + 1;
    }
    local_1d8 = local_1d8->prev;
  } while( true );
}

Assistant:

ImplicitProducer* get_or_add_implicit_producer()
    {
        // Note that since the data is essentially thread-local (key is thread ID),
        // there's a reduced need for fences (memory ordering is already consistent
        // for any individual thread), except for the current table itself.
        
        // Start by looking for the thread ID in the current and all previous hash tables.
        // If it's not found, it must not be in there yet, since this same thread would
        // have added it previously to one of the tables that we traversed.
        
        // Code and algorithm adapted from http://preshing.com/20130605/the-worlds-simplest-lock-free-hash-table
        
#if MCDBGQ_NOLOCKFREE_IMPLICITPRODHASH
        debug::DebugLock lock(implicitProdMutex);
#endif
        
        auto id = details::thread_id();
        auto hashedId = details::hash_thread_id(id);
        
        auto mainHash = implicitProducerHash.load(std::memory_order_acquire);
        for (auto hash = mainHash; hash != nullptr; hash = hash->prev) {
            // Look for the id in this hash
            auto index = hashedId;
            while (true) {      // Not an infinite loop because at least one slot is free in the hash table
                index &= hash->capacity - 1;
                
                auto probedKey = hash->entries[index].key.load(std::memory_order_relaxed);
                if (probedKey == id) {
                    // Found it! If we had to search several hashes deep, though, we should lazily add it
                    // to the current main hash table to avoid the extended search next time.
                    // Note there's guaranteed to be room in the current hash table since every subsequent
                    // table implicitly reserves space for all previous tables (there's only one
                    // implicitProducerHashCount).
                    auto value = hash->entries[index].value;
                    if (hash != mainHash) {
                        index = hashedId;
                        while (true) {
                            index &= mainHash->capacity - 1;
                            probedKey = mainHash->entries[index].key.load(std::memory_order_relaxed);
                            auto empty = details::invalid_thread_id;
#ifdef MOODYCAMEL_CPP11_THREAD_LOCAL_SUPPORTED
                            auto reusable = details::invalid_thread_id2;
                            if ((probedKey == empty    && mainHash->entries[index].key.compare_exchange_strong(empty,    id, std::memory_order_relaxed, std::memory_order_relaxed)) ||
                                (probedKey == reusable && mainHash->entries[index].key.compare_exchange_strong(reusable, id, std::memory_order_acquire, std::memory_order_acquire))) {
#else
                            if ((probedKey == empty    && mainHash->entries[index].key.compare_exchange_strong(empty,    id, std::memory_order_relaxed, std::memory_order_relaxed))) {
#endif
                                mainHash->entries[index].value = value;
                                break;
                            }
                            ++index;
                        }
                    }
                    
                    return value;
                }
                if (probedKey == details::invalid_thread_id) {
                    break;      // Not in this hash table
                }
                ++index;
            }
        }
        
        // Insert!
        auto newCount = 1 + implicitProducerHashCount.fetch_add(1, std::memory_order_relaxed);
        while (true) {
            if (newCount >= (mainHash->capacity >> 1) && !implicitProducerHashResizeInProgress.test_and_set(std::memory_order_acquire)) {
                // We've acquired the resize lock, try to allocate a bigger hash table.
                // Note the acquire fence synchronizes with the release fence at the end of this block, and hence when
                // we reload implicitProducerHash it must be the most recent version (it only gets changed within this
                // locked block).
                mainHash = implicitProducerHash.load(std::memory_order_acquire);
                if (newCount >= (mainHash->capacity >> 1)) {
                    auto newCapacity = mainHash->capacity << 1;
                    while (newCount >= (newCapacity >> 1)) {
                        newCapacity <<= 1;
                    }
                    auto raw = static_cast<char*>((Traits::malloc)(sizeof(ImplicitProducerHash) + std::alignment_of<ImplicitProducerKVP>::value - 1 + sizeof(ImplicitProducerKVP) * newCapacity));
                    if (raw == nullptr) {
                        // Allocation failed
                        implicitProducerHashCount.fetch_sub(1, std::memory_order_relaxed);
                        implicitProducerHashResizeInProgress.clear(std::memory_order_relaxed);
                        return nullptr;
                    }
                    
                    auto newHash = new (raw) ImplicitProducerHash;
                    newHash->capacity = newCapacity;
                    newHash->entries = reinterpret_cast<ImplicitProducerKVP*>(details::align_for<ImplicitProducerKVP>(raw + sizeof(ImplicitProducerHash)));
                    for (size_t i = 0; i != newCapacity; ++i) {
                        new (newHash->entries + i) ImplicitProducerKVP;
                        newHash->entries[i].key.store(details::invalid_thread_id, std::memory_order_relaxed);
                    }
                    newHash->prev = mainHash;
                    implicitProducerHash.store(newHash, std::memory_order_release);
                    implicitProducerHashResizeInProgress.clear(std::memory_order_release);
                    mainHash = newHash;
                }
                else {
                    implicitProducerHashResizeInProgress.clear(std::memory_order_release);
                }
            }
            
            // If it's < three-quarters full, add to the old one anyway so that we don't have to wait for the next table
            // to finish being allocated by another thread (and if we just finished allocating above, the condition will
            // always be true)
            if (newCount < (mainHash->capacity >> 1) + (mainHash->capacity >> 2)) {
                bool recycled;
                auto producer = static_cast<ImplicitProducer*>(recycle_or_create_producer(false, recycled));
                if (producer == nullptr) {
                    implicitProducerHashCount.fetch_sub(1, std::memory_order_relaxed);
                    return nullptr;
                }
                if (recycled) {
                    implicitProducerHashCount.fetch_sub(1, std::memory_order_relaxed);
                }
                
#ifdef MOODYCAMEL_CPP11_THREAD_LOCAL_SUPPORTED
                producer->threadExitListener.callback = &ConcurrentQueue::implicit_producer_thread_exited_callback;
                producer->threadExitListener.userData = producer;
                details::ThreadExitNotifier::subscribe(&producer->threadExitListener);
#endif
                
                auto index = hashedId;
                while (true) {
                    index &= mainHash->capacity - 1;
                    auto probedKey = mainHash->entries[index].key.load(std::memory_order_relaxed);
                    
                    auto empty = details::invalid_thread_id;
#ifdef MOODYCAMEL_CPP11_THREAD_LOCAL_SUPPORTED
                    auto reusable = details::invalid_thread_id2;
                    if ((probedKey == empty    && mainHash->entries[index].key.compare_exchange_strong(empty,    id, std::memory_order_relaxed, std::memory_order_relaxed)) ||
                        (probedKey == reusable && mainHash->entries[index].key.compare_exchange_strong(reusable, id, std::memory_order_acquire, std::memory_order_acquire))) {
#else
                    if ((probedKey == empty    && mainHash->entries[index].key.compare_exchange_strong(empty,    id, std::memory_order_relaxed, std::memory_order_relaxed))) {
#endif
                        mainHash->entries[index].value = producer;
                        break;
                    }
                    ++index;
                }
                return producer;
            }
            
            // Hmm, the old hash is quite full and somebody else is busy allocating a new one.
            // We need to wait for the allocating thread to finish (if it succeeds, we add, if not,
            // we try to allocate ourselves).
            mainHash = implicitProducerHash.load(std::memory_order_acquire);
        }
    }
    
#ifdef MOODYCAMEL_CPP11_THREAD_LOCAL_SUPPORTED
    void implicit_producer_thread_exited(ImplicitProducer* producer)
    {
        // Remove from thread exit listeners
        details::ThreadExitNotifier::unsubscribe(&producer->threadExitListener);
        
        // Remove from hash
#if MCDBGQ_NOLOCKFREE_IMPLICITPRODHASH
        debug::DebugLock lock(implicitProdMutex);
#endif
        auto hash = implicitProducerHash.load(std::memory_order_acquire);
        assert(hash != nullptr);        // The thread exit listener is only registered if we were added to a hash in the first place
        auto id = details::thread_id();
        auto hashedId = details::hash_thread_id(id);
        details::thread_id_t probedKey;
        
        // We need to traverse all the hashes just in case other threads aren't on the current one yet and are
        // trying to add an entry thinking there's a free slot (because they reused a producer)
        for (; hash != nullptr; hash = hash->prev) {
            auto index = hashedId;
            do {
                index &= hash->capacity - 1;
                probedKey = hash->entries[index].key.load(std::memory_order_relaxed);
                if (probedKey == id) {
                    hash->entries[index].key.store(details::invalid_thread_id2, std::memory_order_release);
                    break;
                }
                ++index;
            } while (probedKey != details::invalid_thread_id);      // Can happen if the hash has changed but we weren't put back in it yet, or if we weren't added to this hash in the first place
        }
        
        // Mark the queue as being recyclable
        producer->inactive.store(true, std::memory_order_release);
    }
    
    static void implicit_producer_thread_exited_callback(void* userData)
    {
        auto producer = static_cast<ImplicitProducer*>(userData);
        auto queue = producer->parent;
        queue->implicit_producer_thread_exited(producer);
    }
#endif
    
    //////////////////////////////////
    // Utility functions
    //////////////////////////////////
    
    template<typename U>
    static inline U* create_array(size_t count)
    {
        assert(count > 0);
        auto p = static_cast<U*>((Traits::malloc)(sizeof(U) * count));
        if (p == nullptr) {
            return nullptr;
        }
        
        for (size_t i = 0; i != count; ++i) {
            new (p + i) U();
        }
        return p;
    }
    
    template<typename U>
    static inline void destroy_array(U* p, size_t count)
    {
        if (p != nullptr) {
            assert(count > 0);
            for (size_t i = count; i != 0; ) {
                (p + --i)->~U();
            }
            (Traits::free)(p);
        }
    }
    
    template<typename U>
    static inline U* create()
    {
        auto p = (Traits::malloc)(sizeof(U));
        return p != nullptr ? new (p) U : nullptr;
    }
    
    template<typename U, typename A1>
    static inline U* create(A1&& a1)
    {
        auto p = (Traits::malloc)(sizeof(U));
        return p != nullptr ? new (p) U(std::forward<A1>(a1)) : nullptr;
    }
    
    template<typename U>
    static inline void destroy(U* p)
    {
        if (p != nullptr) {
            p->~U();
        }
        (Traits::free)(p);
    }

private:
    std::atomic<ProducerBase*> producerListTail;
    std::atomic<std::uint32_t> producerCount;
    
    std::atomic<size_t> initialBlockPoolIndex;
    Block* initialBlockPool;
    size_t initialBlockPoolSize;
    
#if !MCDBGQ_USEDEBUGFREELIST
    FreeList<Block> freeList;
#else
    debug::DebugFreeList<Block> freeList;
#endif
    
    std::atomic<ImplicitProducerHash*> implicitProducerHash;
    std::atomic<size_t> implicitProducerHashCount;      // Number of slots logically used
    ImplicitProducerHash initialImplicitProducerHash;
    std::array<ImplicitProducerKVP, INITIAL_IMPLICIT_PRODUCER_HASH_SIZE> initialImplicitProducerHashEntries;
    std::atomic_flag implicitProducerHashResizeInProgress;
    
    std::atomic<std::uint32_t> nextExplicitConsumerId;
    std::atomic<std::uint32_t> globalExplicitConsumerOffset;
    
#if MCDBGQ_NOLOCKFREE_IMPLICITPRODHASH
    debug::DebugMutex implicitProdMutex;
#endif
    
#ifdef MOODYCAMEL_QUEUE_INTERNAL_DEBUG
    std::atomic<ExplicitProducer*> explicitProducers;
    std::atomic<ImplicitProducer*> implicitProducers;
#endif
};


template<typename T, typename Traits>
ProducerToken::ProducerToken(ConcurrentQueue<T, Traits>& queue)
    : producer(queue.recycle_or_create_producer(true))
{
    if (producer != nullptr) {
        producer->token = this;
    }
}

template<typename T, typename Traits>
ProducerToken::ProducerToken(BlockingConcurrentQueue<T, Traits>& queue)
    : producer(reinterpret_cast<ConcurrentQueue<T, Traits>*>(&queue)->recycle_or_create_producer(true))
{
    if (producer != nullptr) {
        producer->token = this;
    }
}

template<typename T, typename Traits>
ConsumerToken::ConsumerToken(ConcurrentQueue<T, Traits>& queue)
    : itemsConsumedFromCurrent(0), currentProducer(nullptr), desiredProducer(nullptr)
{
    initialOffset = queue.nextExplicitConsumerId.fetch_add(1, std::memory_order_release);
    lastKnownGlobalOffset = -1;
}

template<typename T, typename Traits>
ConsumerToken::ConsumerToken(BlockingConcurrentQueue<T, Traits>& queue)
    : itemsConsumedFromCurrent(0), currentProducer(nullptr), desiredProducer(nullptr)
{
    initialOffset = reinterpret_cast<ConcurrentQueue<T, Traits>*>(&queue)->nextExplicitConsumerId.fetch_add(1, std::memory_order_release);
    lastKnownGlobalOffset = -1;
}

template<typename T, typename Traits>
inline void swap(ConcurrentQueue<T, Traits>& a, ConcurrentQueue<T, Traits>& b) MOODYCAMEL_NOEXCEPT
{
    a.swap(b);
}

inline void swap(ProducerToken& a, ProducerToken& b) MOODYCAMEL_NOEXCEPT
{
    a.swap(b);
}

inline void swap(ConsumerToken& a, ConsumerToken& b) MOODYCAMEL_NOEXCEPT
{
    a.swap(b);
}

template<typename T, typename Traits>
inline void swap(typename ConcurrentQueue<T, Traits>::ImplicitProducerKVP& a, typename ConcurrentQueue<T, Traits>::ImplicitProducerKVP& b) MOODYCAMEL_NOEXCEPT
{
    a.swap(b);
}

}